

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O2

Vec_Int_t * Aig_ManPartitionDfs(Aig_Man_t *p,int nPartSize,int fPreorder)

{
  Vec_Int_t *p_00;
  Vec_Ptr_t *p_01;
  void *pvVar1;
  int iVar2;
  int iVar3;
  
  p_00 = Vec_IntStart(p->vObjs->nSize);
  if (fPreorder == 0) {
    p_01 = Aig_ManDfs(p,1);
    iVar3 = p_01->nSize;
    iVar2 = 0;
    while (0 < iVar3) {
      iVar3 = iVar3 + -1;
      pvVar1 = Vec_PtrEntry(p_01,iVar3);
      Vec_IntWriteEntry(p_00,*(int *)((long)pvVar1 + 0x24),iVar2 / nPartSize);
      iVar2 = iVar2 + 1;
    }
  }
  else {
    p_01 = Aig_ManDfsPreorder(p,1);
    for (iVar3 = 0; iVar3 < p_01->nSize; iVar3 = iVar3 + 1) {
      pvVar1 = Vec_PtrEntry(p_01,iVar3);
      Vec_IntWriteEntry(p_00,*(int *)((long)pvVar1 + 0x24),iVar3 / nPartSize);
    }
  }
  Vec_PtrFree(p_01);
  return p_00;
}

Assistant:

Vec_Int_t * Aig_ManPartitionDfs( Aig_Man_t * p, int nPartSize, int fPreorder )
{
    Vec_Int_t * vId2Part; 
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    vId2Part = Vec_IntStart( Aig_ManObjNumMax(p) );
    if ( fPreorder )
    {
        vNodes = Aig_ManDfsPreorder( p, 1 );
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
            Vec_IntWriteEntry( vId2Part, Aig_ObjId(pObj), Counter++/nPartSize );
    }
    else
    {
        vNodes = Aig_ManDfs( p, 1 );
        Vec_PtrForEachEntryReverse( Aig_Obj_t *, vNodes, pObj, i )
            Vec_IntWriteEntry( vId2Part, Aig_ObjId(pObj), Counter++/nPartSize );
    }
    Vec_PtrFree( vNodes );
    return vId2Part;
}